

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

void Wlc_ObjSetCi(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Wlc_Obj_t *pWVar4;
  int *piVar5;
  long lVar6;
  int iVar7;
  
  if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3d) != (undefined1  [24])0x1)
  {
    __assert_fail("Wlc_ObjIsCi(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcNtk.c"
                  ,0xa9,"void Wlc_ObjSetCi(Wlc_Ntk_t *, Wlc_Obj_t *)");
  }
  if (pObj->nFanins != 0) {
    __assert_fail("Wlc_ObjFaninNum(pObj) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcNtk.c"
                  ,0xaa,"void Wlc_ObjSetCi(Wlc_Ntk_t *, Wlc_Obj_t *)");
  }
  uVar1 = (p->vPis).nSize;
  uVar2 = (p->vCis).nSize;
  if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3) == (undefined1  [24])0x1
      && uVar1 != uVar2) {
    if (((int)uVar1 < 0) || ((int)uVar2 < (int)uVar1)) {
      __assert_fail("iHere >= 0 && iHere <= p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x41c,"void Vec_IntInsert(Vec_Int_t *, int, int)");
    }
    pWVar4 = p->pObjs;
    Vec_IntPush(&p->vCis,0);
    iVar3 = (p->vCis).nSize;
    iVar7 = iVar3 + -1;
    piVar5 = (p->vCis).pArray;
    if ((int)uVar1 < iVar7) {
      lVar6 = (long)iVar3 + -1;
      do {
        piVar5[lVar6] = piVar5[lVar6 + -1];
        lVar6 = lVar6 + -1;
      } while ((long)(ulong)uVar1 < lVar6);
      iVar7 = (int)lVar6;
    }
    piVar5[iVar7] = (int)((ulong)((long)pObj - (long)pWVar4) >> 3) * -0x55555555;
    if (0 < (p->vCis).nSize) {
      lVar6 = 0;
      do {
        iVar3 = (p->vCis).pArray[lVar6];
        if (((long)iVar3 < 1) || (p->nObjsAlloc <= iVar3)) {
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                        ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        p->pObjs[iVar3].field_10.Fanins[1] = (int)lVar6;
        lVar6 = lVar6 + 1;
      } while (lVar6 < (p->vCis).nSize);
    }
  }
  else {
    (pObj->field_10).Fanins[1] = uVar2;
    Vec_IntPush(&p->vCis,(int)((ulong)((long)pObj - (long)p->pObjs) >> 3) * -0x55555555);
  }
  if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) != (undefined1  [24])0x1)
  {
    return;
  }
  Vec_IntPush(&p->vPis,(int)((ulong)((long)pObj - (long)p->pObjs) >> 3) * -0x55555555);
  return;
}

Assistant:

void Wlc_ObjSetCi( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )
{
    assert( Wlc_ObjIsCi(pObj) );
    assert( Wlc_ObjFaninNum(pObj) == 0 );
    if ( Wlc_NtkPiNum(p) == Wlc_NtkCiNum(p) || pObj->Type != WLC_OBJ_PI )
    {
        pObj->Fanins[1] = Vec_IntSize(&p->vCis);
        Vec_IntPush( &p->vCis, Wlc_ObjId(p, pObj) );
    }
    else // insert in the array of CI at the end of PIs
    {
        Wlc_Obj_t * pTemp; int i;
        Vec_IntInsert( &p->vCis, Wlc_NtkPiNum(p), Wlc_ObjId(p, pObj) );
        // other CI IDs are invalidated... naive fix!
        Wlc_NtkForEachCi( p, pTemp, i )
            pTemp->Fanins[1] = i;
    }
    if ( pObj->Type == WLC_OBJ_PI )
        Vec_IntPush( &p->vPis, Wlc_ObjId(p, pObj) );
}